

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_bufput_bufstr(jit_State *J)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  IRIns *pIVar4;
  bool bVar5;
  uint in_EAX;
  TRef TVar6;
  ulong uVar7;
  bool bVar8;
  
  if ((J->flags & 0x80000) == 0) goto LAB_00127b46;
  uVar1 = (J->fold).right[0].field_0.op2;
  if ((((J->fold).left[0].field_1.o == 'U') && ((J->fold).left[0].field_0.op2 == 0)) &&
     ((J->fold).left[0].field_0.prev == uVar1)) {
    uVar2 = (J->fold).left[0].field_0.op1;
    in_EAX = (uint)uVar2;
    pIVar4 = (J->cur).ir;
    if (uVar2 != pIVar4[uVar1].field_0.op1) goto LAB_00127afc;
    uVar1 = (J->fold).ins.field_0.op1;
    in_EAX = (uint)uVar1;
    uVar7 = (ulong)((uint)uVar1 * 8);
    *(undefined2 *)((long)pIVar4 + uVar7 + 2) = 1;
    *(IRRef1 *)((long)(J->cur).ir + uVar7) = (J->fold).right[0].field_0.op1;
    bVar5 = false;
  }
  else {
LAB_00127afc:
    pIVar4 = (J->cur).ir;
    bVar5 = true;
    if (*(short *)((long)pIVar4 + (ulong)uVar1 * 8 + 2) == 0) {
      uVar2 = (J->fold).right[0].field_0.op1;
      uVar7 = (ulong)uVar2;
      in_EAX = (uint)uVar2;
      if ((*(char *)((long)pIVar4 + uVar7 * 8 + 5) == 'a') &&
         (uVar2 = *(ushort *)((long)pIVar4 + uVar7 * 8 + 2), (ushort)(uVar2 - 0x13) < 4)) {
        uVar7 = (ulong)pIVar4[uVar7].field_0.op1;
        uVar3 = pIVar4[uVar7].field_0.op1;
        if (uVar2 == IRCALL_lj_buf_putstr_rep) {
          bVar8 = pIVar4[uVar3].field_0.op1 == uVar1;
          bVar5 = !bVar8;
          if (bVar8) {
            in_EAX = lj_ir_call(J,IRCALL_lj_buf_putstr_rep,(ulong)(J->fold).ins.field_0.op1,
                                (ulong)*(ushort *)((long)pIVar4 + (ulong)uVar3 * 8 + 2),
                                (ulong)*(ushort *)((long)pIVar4 + uVar7 * 8 + 2));
          }
        }
        else if (uVar3 == uVar1) {
          bVar5 = false;
          in_EAX = lj_ir_call(J,(uint)uVar2,(ulong)(J->fold).ins.field_0.op1,
                              (ulong)*(ushort *)((long)pIVar4 + uVar7 * 8 + 2));
        }
      }
    }
  }
  if (!bVar5) {
    return in_EAX;
  }
LAB_00127b46:
  TVar6 = lj_ir_emit(J);
  return TVar6;
}

Assistant:

LJFOLD(BUFPUT any BUFSTR)
LJFOLDF(bufput_bufstr)
{
  if ((J->flags & JIT_F_OPT_FWD)) {
    IRRef hdr = fright->op2;
    /* New buffer, no other buffer op inbetween and same buffer? */
    if (fleft->o == IR_BUFHDR && fleft->op2 == IRBUFHDR_RESET &&
	fleft->prev == hdr &&
	fleft->op1 == IR(hdr)->op1) {
      IRRef ref = fins->op1;
      IR(ref)->op2 = IRBUFHDR_APPEND;  /* Modify BUFHDR. */
      IR(ref)->op1 = fright->op1;
      return ref;
    }
    /* Replay puts to global temporary buffer. */
    if (IR(hdr)->op2 == IRBUFHDR_RESET) {
      IRIns *ir = IR(fright->op1);
      /* For now only handle single string.reverse .lower .upper .rep. */
      if (ir->o == IR_CALLL &&
	  ir->op2 >= IRCALL_lj_buf_putstr_reverse &&
	  ir->op2 <= IRCALL_lj_buf_putstr_rep) {
	IRIns *carg1 = IR(ir->op1);
	if (ir->op2 == IRCALL_lj_buf_putstr_rep) {
	  IRIns *carg2 = IR(carg1->op1);
	  if (carg2->op1 == hdr) {
	    return lj_ir_call(J, ir->op2, fins->op1, carg2->op2, carg1->op2);
	  }
	} else if (carg1->op1 == hdr) {
	  return lj_ir_call(J, ir->op2, fins->op1, carg1->op2);
	}
      }
    }
  }
  return EMITFOLD;  /* Always emit, CSE later. */
}